

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agate.cpp
# Opt level: O0

void Show_Dialog_Centered(Am_Object *dlg,Am_Object *win)

{
  Am_Value *pAVar1;
  ushort uVar2;
  Am_Object local_38;
  int local_30;
  int local_2c;
  int dlg_height;
  int dlg_width;
  int win_height;
  int win_top;
  int win_width;
  int win_left;
  Am_Object *win_local;
  Am_Object *dlg_local;
  
  uVar2 = (ushort)win;
  _win_width = win;
  win_local = dlg;
  pAVar1 = (Am_Value *)Am_Object::Get(uVar2,100);
  win_top = Am_Value::operator_cast_to_int(pAVar1);
  pAVar1 = (Am_Value *)Am_Object::Get(uVar2,0x66);
  win_height = Am_Value::operator_cast_to_int(pAVar1);
  pAVar1 = (Am_Value *)Am_Object::Get(uVar2,0x65);
  dlg_width = Am_Value::operator_cast_to_int(pAVar1);
  pAVar1 = (Am_Value *)Am_Object::Get(uVar2,0x67);
  dlg_height = Am_Value::operator_cast_to_int(pAVar1);
  uVar2 = (ushort)dlg;
  pAVar1 = (Am_Value *)Am_Object::Get(uVar2,0x66);
  local_2c = Am_Value::operator_cast_to_int(pAVar1);
  pAVar1 = (Am_Value *)Am_Object::Get(uVar2,0x67);
  local_30 = Am_Value::operator_cast_to_int(pAVar1);
  Am_Object::Set(uVar2,100,(ulong)(uint)(win_top + (win_height - local_2c) / 2));
  Am_Object::Set(uVar2,0x65,(ulong)(uint)(dlg_width + (dlg_height - local_30) / 2));
  Am_Object::Set(uVar2,true,1);
  Am_Object::Am_Object(&local_38,(Am_Object *)dlg);
  Am_To_Top((Am_Object *)&local_38);
  Am_Object::~Am_Object(&local_38);
  return;
}

Assistant:

void
Show_Dialog_Centered(Am_Object dlg, Am_Object win)
{
  // center save dialog within the current win
  int win_left = win.Get(Am_LEFT);
  int win_width = win.Get(Am_WIDTH);
  int win_top = win.Get(Am_TOP);
  int win_height = win.Get(Am_HEIGHT);
  int dlg_width = dlg.Get(Am_WIDTH);
  int dlg_height = dlg.Get(Am_HEIGHT);
  dlg.Set(Am_LEFT, win_left + (win_width - dlg_width) / 2);
  dlg.Set(Am_TOP, win_top + (win_height - dlg_height) / 2);

  // show it
  dlg.Set(Am_VISIBLE, true);
  Am_To_Top(dlg);
}